

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDiag.cpp
# Opt level: O3

JsErrorCode JsDiagGetSource(uint scriptId,JsValueRef *source)

{
  ScriptContext *scriptContext;
  bool bVar1;
  JsErrorCode JVar2;
  JsrtContext *pJVar3;
  JsrtDebugManager *this;
  DynamicObject *pDVar4;
  void *unaff_retaddr;
  undefined1 auStack_98 [8];
  TTDebuggerAbortException anon_var_0;
  undefined1 local_60 [8];
  EnterScriptObject __enterScriptObject;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  pJVar3 = JsrtContext::GetCurrent();
  JVar2 = CheckContext(pJVar3,false,false);
  if (JVar2 == JsNoError) {
    scriptContext =
         (((pJVar3->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
    AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
              ((AutoNestedHandledExceptionType *)((long)&__enterScriptObject.library + 4),
               ExceptionType_JavascriptException|ExceptionType_OutOfMemory);
    anon_var_0.m_staticAbortMessage = (char16 *)0x0;
    anon_var_0.m_optEventTime = 0;
    anon_var_0.m_optMoveMode = 0;
    auStack_98 = (undefined1  [8])0x0;
    anon_var_0.m_abortCode = 0;
    anon_var_0._4_4_ = 0;
    Js::EnterScriptObject::EnterScriptObject
              ((EnterScriptObject *)local_60,scriptContext,(ScriptEntryExitRecord *)auStack_98,
               unaff_retaddr,&stack0x00000000,true,true,true);
    Js::ScriptContext::OnScriptStart(scriptContext,true,true);
    Js::EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_60);
    if (source == (JsValueRef *)0x0) {
      JVar2 = JsErrorNullArgument;
    }
    else {
      *source = (JsValueRef)0x0;
      pJVar3 = JsrtContext::GetCurrent();
      this = JsrtRuntime::GetJsrtDebugManager((pJVar3->runtime).ptr);
      JVar2 = JsErrorDiagNotInDebugMode;
      if (this != (JsrtDebugManager *)0x0) {
        bVar1 = JsrtDebugManager::IsDebugEventCallbackSet(this);
        if (bVar1) {
          pDVar4 = JsrtDebugManager::GetSource(this,scriptContext,scriptId);
          if (pDVar4 == (DynamicObject *)0x0) {
            JVar2 = JsErrorInvalidArgument;
          }
          else {
            *source = pDVar4;
            JVar2 = JsNoError;
          }
        }
      }
    }
    Js::EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_60);
    AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
              ((AutoNestedHandledExceptionType *)((long)&__enterScriptObject.library + 4));
  }
  return JVar2;
}

Assistant:

CHAKRA_API JsDiagGetSource(
    _In_ unsigned int scriptId,
    _Out_ JsValueRef *source)
{
#ifndef ENABLE_SCRIPT_DEBUGGING
    return JsErrorCategoryUsage;
#else
    return ContextAPIWrapper_NoRecord<false>([&](Js::ScriptContext *scriptContext) -> JsErrorCode {

        PARAM_NOT_NULL(source);

        *source = JS_INVALID_REFERENCE;

        JsrtContext *currentContext = JsrtContext::GetCurrent();

        JsrtDebugManager* jsrtDebugManager = currentContext->GetRuntime()->GetJsrtDebugManager();

        VALIDATE_IS_DEBUGGING(jsrtDebugManager);

        Js::DynamicObject* sourceObject = jsrtDebugManager->GetSource(scriptContext, scriptId);

        if (sourceObject != nullptr)
        {
            *source = sourceObject;
            return JsNoError;
        }

        return JsErrorInvalidArgument;
    });
#endif
}